

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

void __thiscall
r_exec::NotificationView::NotificationView
          (NotificationView *this,Code *origin,Code *destination,Code *marker)

{
  atomic_int_fast64_t *paVar1;
  Code *pCVar2;
  long lVar3;
  float fVar4;
  Atom local_2c [4];
  
  r_exec::View::View(&this->super_View);
  (this->super_View).super_View.super__Object._vptr__Object = (_func_int **)&PTR__View_001c1640;
  r_code::Atom::SSet((ushort)local_2c,(uchar)r_exec::View::ViewOpcode);
  r_code::Atom::operator=((Atom *)&(this->super_View).super_View.field_0x28,local_2c);
  r_code::Atom::~Atom(local_2c);
  r_code::Atom::Float(0.0);
  r_code::Atom::operator=((Atom *)&(this->super_View).super_View.field_0x2c,local_2c);
  r_code::Atom::~Atom(local_2c);
  r_code::Atom::IPointer((ushort)local_2c);
  r_code::Atom::operator=((Atom *)&(this->super_View).super_View.field_0x30,local_2c);
  r_code::Atom::~Atom(local_2c);
  r_code::Atom::Float(1.0);
  r_code::Atom::operator=((Atom *)&(this->super_View).super_View.field_0x34,local_2c);
  r_code::Atom::~Atom(local_2c);
  lVar3 = r_code::Mem::Get();
  r_code::Atom::Float((float)*(ulong *)(lVar3 + 0x88));
  r_code::Atom::operator=((Atom *)&(this->super_View).super_View.field_0x38,local_2c);
  r_code::Atom::~Atom(local_2c);
  r_code::Atom::RPointer((ushort)local_2c);
  r_code::Atom::operator=((Atom *)&(this->super_View).super_View.field_0x3c,local_2c);
  r_code::Atom::~Atom(local_2c);
  r_code::Atom::RPointer((ushort)local_2c);
  r_code::Atom::operator=((Atom *)&(this->super_View).super_View.field_0x40,local_2c);
  r_code::Atom::~Atom(local_2c);
  r_code::Atom::Timestamp();
  r_code::Atom::operator=((Atom *)&(this->super_View).super_View.field_0x44,local_2c);
  r_code::Atom::~Atom(local_2c);
  r_code::Atom::Atom(local_2c,0);
  r_code::Atom::operator=((Atom *)&(this->super_View).super_View.field_0x48,local_2c);
  r_code::Atom::~Atom(local_2c);
  r_code::Atom::Atom(local_2c,0);
  r_code::Atom::operator=((Atom *)&(this->super_View).super_View.field_0x4c,local_2c);
  r_code::Atom::~Atom(local_2c);
  (this->super_View).super_View.references[0] = destination;
  (this->super_View).super_View.references[1] = origin;
  fVar4 = (float)r_code::Atom::asFloat();
  (this->super_View).initial_sln = (double)fVar4;
  pCVar2 = (Code *)(this->super_View).super_View.object.object;
  if (pCVar2 != marker) {
    if (pCVar2 != (Code *)0x0) {
      LOCK();
      paVar1 = &(pCVar2->super__Object).refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if ((pCVar2->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
        (*(pCVar2->super__Object)._vptr__Object[1])();
      }
    }
    (this->super_View).super_View.object.object = &marker->super__Object;
    if (marker != (Code *)0x0) {
      LOCK();
      paVar1 = &(marker->super__Object).refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
  }
  return;
}

Assistant:

NotificationView::NotificationView(Code *origin, Code *destination, Code *marker): View()
{
    code(VIEW_OPCODE) = r_code::Atom::SSet(ViewOpcode, VIEW_ARITY); // Structured Set.
    code(VIEW_SYNC) = r_code::Atom::Float(View::SYNC_ONCE); // sync once.
    code(VIEW_IJT) = r_code::Atom::IPointer(VIEW_ARITY + 1); // iptr to ijt.
    code(VIEW_SLN) = r_code::Atom::Float(1); // sln.
    code(VIEW_RES) = r_code::Atom::Float(_Mem::Get()->get_ntf_mk_res()); // res.
    code(VIEW_HOST) = r_code::Atom::RPointer(0); // destination.
    code(VIEW_ORG) = r_code::Atom::RPointer(1); // origin.
    code(VIEW_ARITY + 1) = r_code::Atom::Timestamp(); // ijt will be set at injection time.
    code(VIEW_ARITY + 2) = 0;
    code(VIEW_ARITY + 3) = 0;
    references[0] = destination;
    references[1] = origin;
    reset_init_sln();
    object = marker;
}